

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O0

int32 make_mdef_from_list(char *mdeffile,char **CIlist,int32 nciphones,heapelement_t **CDheap,
                         int32 cdheapsize,char *pgm)

{
  uint n_tri_00;
  uint n_ci;
  int iVar1;
  uint32 n_total_00;
  acmod_id_t base_00;
  acmod_id_t left_context;
  acmod_id_t right_context;
  word_posn_t posn_00;
  cmd_ln_t *cmdln;
  long lVar2;
  char **base_str_00;
  char **left_str_00;
  char **right_str_00;
  char **posn_str_00;
  uint32 *tmat_00;
  uint32 **state;
  char *pcVar3;
  heapelement_t *heapel;
  acmod_set_t *acmod_set_00;
  FILE *__stream;
  FILE *fp;
  heapelement_t *cdphone;
  uint32 **smap;
  uint32 *tmat;
  char *na_attr [2];
  char *base_attr [2];
  char *filler_attr [2];
  int local_c0;
  int32 k;
  int32 j;
  int32 i;
  acmod_set_t *acmod_set;
  word_posn_t posn;
  acmod_id_t right;
  acmod_id_t left;
  acmod_id_t base;
  char **posn_str;
  char **right_str;
  char **left_str;
  char **base_str;
  int32 n_tied_tmat;
  int32 n_tied_state_cd;
  int32 n_tied_state_ci;
  int32 n_total;
  int32 n_state_pm;
  int32 n_tri;
  int32 n_base;
  char *pgm_local;
  heapelement_t **pphStack_50;
  int32 cdheapsize_local;
  heapelement_t **CDheap_local;
  char **ppcStack_40;
  int32 nciphones_local;
  char **CIlist_local;
  char *mdeffile_local;
  
  base_attr[1] = "filler";
  na_attr[1] = "base";
  base_attr[0] = (char *)0x0;
  tmat = (uint32 *)anon_var_dwarf_1071;
  na_attr[0] = (char *)0x0;
  pgm_local._4_4_ = cdheapsize;
  pphStack_50 = CDheap;
  CDheap_local._4_4_ = nciphones;
  ppcStack_40 = CIlist;
  CIlist_local = (char **)mdeffile;
  cmdln = cmd_ln_get();
  lVar2 = cmd_ln_int_r(cmdln,"-n_state_pm");
  n_ci = CDheap_local._4_4_;
  n_tri_00 = pgm_local._4_4_;
  iVar1 = (int)lVar2;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x381,"%d n_base, %d n_tri\n",(ulong)CDheap_local._4_4_,(ulong)pgm_local._4_4_);
  n_total_00 = n_ci + n_tri_00;
  base_str_00 = (char **)__ckd_calloc__((long)(int)n_total_00,8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                        ,0x388);
  left_str_00 = (char **)__ckd_calloc__((long)(int)n_total_00,8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                        ,0x389);
  right_str_00 = (char **)__ckd_calloc__((long)(int)n_total_00,8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                         ,0x38a);
  posn_str_00 = (char **)__ckd_calloc__((long)(int)n_total_00,8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                        ,0x38b);
  tmat_00 = (uint32 *)
            __ckd_calloc__((long)(int)n_total_00,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                           ,0x38d);
  state = (uint32 **)
          __ckd_calloc_2d__((long)(int)n_total_00,(long)iVar1,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                            ,0x38f);
  for (k = 0; k < (int)n_ci; k = k + 1) {
    pcVar3 = strdup(ppcStack_40[k]);
    base_str_00[k] = pcVar3;
  }
  for (local_c0 = 0; local_c0 < (int)n_tri_00; local_c0 = local_c0 + 1) {
    heapel = yanktop(&stack0xffffffffffffffb0,pgm_local._4_4_,(int32 *)((long)&pgm_local + 4));
    pcVar3 = strdup(heapel->basephone);
    base_str_00[k] = pcVar3;
    pcVar3 = strdup(heapel->leftcontext);
    left_str_00[k] = pcVar3;
    pcVar3 = strdup(heapel->rightcontext);
    right_str_00[k] = pcVar3;
    pcVar3 = strdup(heapel->wordposition);
    posn_str_00[k] = pcVar3;
    free_heapelement(heapel);
    k = k + 1;
  }
  if (pgm_local._4_4_ != 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x39e,"Error in CD heap! Error in dictionary or phone list!\n");
    exit(1);
  }
  filler_attr[1]._4_4_ = 0;
  for (k = 0; k < (int)n_total_00; k = k + 1) {
    for (local_c0 = 0; local_c0 < iVar1; local_c0 = local_c0 + 1) {
      state[k][local_c0] = filler_attr[1]._4_4_;
      filler_attr[1]._4_4_ = filler_attr[1]._4_4_ + 1;
    }
  }
  acmod_set_00 = acmod_set_new();
  acmod_set_set_n_ci_hint(acmod_set_00,n_ci);
  acmod_set_set_n_tri_hint(acmod_set_00,n_tri_00);
  for (k = 0; k < (int)n_ci; k = k + 1) {
    if (*base_str_00[k] == '+') {
      right = acmod_set_add_ci(acmod_set_00,base_str_00[k],base_attr + 1);
    }
    else {
      right = acmod_set_add_ci(acmod_set_00,base_str_00[k],na_attr + 1);
    }
    tmat_00[right] = right;
  }
  while( true ) {
    if ((int)n_total_00 <= k) {
      __stream = fopen((char *)CIlist_local,"w");
      if (__stream != (FILE *)0x0) {
        output_model_def((FILE *)__stream,pgm,base_str_00,left_str_00,right_str_00,posn_str_00,
                         tmat_00,state,n_ci,n_tri_00,n_total_00,iVar1 + 1,
                         n_ci * iVar1 + n_tri_00 * iVar1,n_ci * iVar1,n_ci);
        fclose(__stream);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                ,0x3c9,"Wrote mdef file %s\n",CIlist_local);
        for (local_c0 = 0; local_c0 < (int)n_tri_00; local_c0 = local_c0 + 1) {
          if (base_str_00[local_c0] != (char *)0x0) {
            free(base_str_00[local_c0]);
          }
          if (left_str_00[local_c0] != (char *)0x0) {
            free(left_str_00[local_c0]);
          }
          if (right_str_00[local_c0] != (char *)0x0) {
            free(right_str_00[local_c0]);
          }
          if (posn_str_00[local_c0] != (char *)0x0) {
            free(posn_str_00[local_c0]);
          }
        }
        free(base_str_00);
        free(left_str_00);
        free(right_str_00);
        free(posn_str_00);
        ckd_free_2d(state);
        return 0;
      }
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x3c2,"Unable to open %s for writing!\n",CIlist_local);
      exit(1);
    }
    base_00 = acmod_set_name2id(acmod_set_00,base_str_00[k]);
    if (base_00 == 0xffffffff) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x3b5,"Error in dictionary or phonelist. Bad basephone %s in triphone list!\n",
              base_str_00[k]);
      exit(1);
    }
    left_context = acmod_set_name2id(acmod_set_00,left_str_00[k]);
    if (left_context == 0xffffffff) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x3b7,"Error in dictionary or phonelist. Bad leftphone %s in triphone list!\n",
              left_str_00[k]);
      exit(1);
    }
    right_context = acmod_set_name2id(acmod_set_00,right_str_00[k]);
    if (right_context == 0xffffffff) break;
    posn_00 = posnstr2wordpos(posn_str_00[k]);
    acmod_set_add_tri(acmod_set_00,base_00,left_context,right_context,posn_00,(char **)&tmat);
    tmat_00[k] = base_00;
    k = k + 1;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x3b9,"Error in dictionary or phonelist. Bad rightphone %s in triphone list!\n",
          right_str_00[k]);
  exit(1);
}

Assistant:

int32 make_mdef_from_list(const char *mdeffile,
			char **CIlist, 
			int32  nciphones,
			heapelement_t **CDheap,
			int32  cdheapsize,
			char  *pgm)
{
    int32  n_base, n_tri, n_state_pm, n_total;
    int32  n_tied_state_ci, n_tied_state_cd, n_tied_tmat;
    char   **base_str, **left_str, **right_str, **posn_str;
    acmod_id_t base, left, right;
    word_posn_t posn;
    acmod_set_t  *acmod_set;
    int32 i,j,k;
    const char *filler_attr[] = {"filler", NULL};
    const char *base_attr[] = {"base", NULL};
    const char *na_attr[] = {"n/a", NULL};
    uint32 *tmat; 
    uint32 **smap;
    heapelement_t *cdphone;
    FILE  *fp;

    n_state_pm = cmd_ln_int32("-n_state_pm") + 1;
    n_base = nciphones;
    n_tri = cdheapsize;
    E_INFO("%d n_base, %d n_tri\n", n_base, n_tri);

    n_tied_state_ci = n_base * (n_state_pm-1);
    n_tied_state_cd = n_tri * (n_state_pm-1);
    n_tied_tmat = n_base;

    n_total = n_base + n_tri;
    base_str = ckd_calloc(n_total, sizeof(char *));
    left_str = ckd_calloc(n_total, sizeof(char *));
    right_str = ckd_calloc(n_total, sizeof(char *));
    posn_str = ckd_calloc(n_total, sizeof(char *));

    tmat = ckd_calloc(n_total, sizeof(uint32));

    smap = (uint32 **)ckd_calloc_2d(n_total, n_state_pm-1, sizeof(uint32));

    for (i = 0; i < n_base; i++) {
        base_str[i] = strdup(CIlist[i]);
    }

    for (j = 0; j < n_tri; j++,i++) {
        cdphone = yanktop(&CDheap,cdheapsize,&cdheapsize);
	base_str[i] = strdup(cdphone->basephone);
	left_str[i] = strdup(cdphone->leftcontext);
	right_str[i] = strdup(cdphone->rightcontext);
	posn_str[i] = strdup(cdphone->wordposition);
	free_heapelement(cdphone);
    }
    if (cdheapsize != 0) 
        E_FATAL("Error in CD heap! Error in dictionary or phone list!\n");

    for (i = 0, k = 0; i < n_total; i++)
        for (j = 0; j < n_state_pm-1; j++)
            smap[i][j] = k++;

    acmod_set = acmod_set_new();

    acmod_set_set_n_ci_hint(acmod_set, n_base);
    acmod_set_set_n_tri_hint(acmod_set, n_tri);

    for (i = 0; i < n_base; i++) {
        if (base_str[i][0] == '+') {
            base = acmod_set_add_ci(acmod_set, base_str[i], filler_attr);
        }
        else {
            base = acmod_set_add_ci(acmod_set, base_str[i], base_attr);
        }
        tmat[base] = base;
    }

    for (; i < n_total; i++) {
        if ((base = acmod_set_name2id(acmod_set, base_str[i])) == NO_ACMOD)
	    E_FATAL("Error in dictionary or phonelist. Bad basephone %s in triphone list!\n",base_str[i]);
        if ((left = acmod_set_name2id(acmod_set, left_str[i])) == NO_ACMOD)
	    E_FATAL("Error in dictionary or phonelist. Bad leftphone %s in triphone list!\n",left_str[i]);
        if ((right = acmod_set_name2id(acmod_set, right_str[i])) == NO_ACMOD)
	    E_FATAL("Error in dictionary or phonelist. Bad rightphone %s in triphone list!\n",right_str[i]);

	posn = posnstr2wordpos(posn_str[i]);

        acmod_set_add_tri(acmod_set, base, left, right, posn, na_attr);
        tmat[i] = base;
    }

    if ((fp = fopen(mdeffile, "w")) == NULL)
        E_FATAL("Unable to open %s for writing!\n",mdeffile);
    output_model_def(fp,
             pgm,
             base_str, left_str, right_str, posn_str, tmat, smap,
             n_base, n_tri, n_total, n_state_pm,
             n_tied_state_ci+n_tied_state_cd, n_tied_state_ci, n_tied_tmat);
    fclose(fp);
    E_INFO("Wrote mdef file %s\n",mdeffile);

    for (j = 0; j < n_tri; j++,i++) {
	if (base_str[j] != NULL) free(base_str[j]);
	if (left_str[j] != NULL) free(left_str[j]);
	if (right_str[j] != NULL) free(right_str[j]);
	if (posn_str[j] != NULL) free(posn_str[j]);
    }
    free(base_str); free(left_str); free(right_str); free(posn_str);
    ckd_free_2d((void**)smap);

    return 0;
}